

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

type_conflict2 __thiscall
args::ValueReader::operator()
          (ValueReader *this,string *name,string *value,tuple<int,_int> *destination)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *this_00;
  istringstream ss;
  ostringstream problem;
  string local_340 [32];
  long local_320 [2];
  long local_310;
  long local_300;
  long local_2f8;
  ios_base local_2a8 [264];
  ostringstream local_1a0 [376];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_320,(string *)value,_S_in);
  operator>>((istream *)local_320,destination);
  uVar1 = *(uint *)((long)&local_300 + *(long *)(local_320[0] + -0x18));
  if ((uVar1 & 5) == 0) {
    std::ws<char,std::char_traits<char>>((istream *)local_320);
  }
  local_2f8 = local_2f8 - local_300;
  if (local_2f8 == 0) {
    local_2f8 = (**(code **)(local_310 + 0x38))();
  }
  if (((uVar1 & 5) == 0) && (local_2f8 < 1)) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_320);
    std::ios_base::~ios_base(local_2a8);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Argument \'",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\' received invalid value type \'",0x1f);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_340);
  *(undefined ***)this_00 = &PTR__runtime_error_0021e7a0;
  __cxa_throw(this_00,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<!std::is_assignable<T, std::string>::value, bool>::type
        operator ()(const std::string &name, const std::string &value, T &destination)
        {
            std::istringstream ss(value);
            bool failed = !(ss >> destination);

            if (!failed)
            {
                ss >> std::ws;
            }

            if (ss.rdbuf()->in_avail() > 0 || failed)
            {
#ifdef ARGS_NOEXCEPT
                (void)name;
                return false;
#else
                std::ostringstream problem;
                problem << "Argument '" << name << "' received invalid value type '" << value << "'";
                throw ParseError(problem.str());
#endif
            }
            return true;
        }